

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O2

int ssl_write_encrypted_pms(mbedtls_ssl_context *ssl,size_t offset,size_t *olen,size_t pms_offset)

{
  ulong uVar1;
  mbedtls_ssl_handshake_params *pmVar2;
  mbedtls_ssl_config *pmVar3;
  mbedtls_x509_crt *pmVar4;
  int iVar5;
  int iVar6;
  char *text;
  uchar *ver;
  ulong uVar7;
  
  iVar6 = ssl->minor_ver;
  uVar7 = (ulong)((uint)(iVar6 != 0) * 2);
  uVar1 = uVar7 + offset;
  if (0x4000 < uVar1) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0x7e9,"buffer too small for encrypted pms");
    return -0x6a00;
  }
  pmVar2 = ssl->handshake;
  ver = pmVar2->premaster + pms_offset;
  pmVar3 = ssl->conf;
  mbedtls_ssl_write_version
            ((uint)pmVar3->max_major_ver,(uint)pmVar3->max_minor_ver,
             *(uint *)&pmVar3->field_0x174 >> 1 & 1,ver);
  iVar5 = (*ssl->conf->f_rng)(ssl->conf->p_rng,pmVar2->premaster + pms_offset + 2,0x2e);
  if (iVar5 == 0) {
    ssl->handshake->pmslen = 0x30;
    pmVar4 = ssl->session_negotiate->peer_cert;
    if (pmVar4 == (mbedtls_x509_crt *)0x0) {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x801,"certificate required");
      return -0x7700;
    }
    iVar5 = mbedtls_pk_can_do(&pmVar4->pk,MBEDTLS_PK_RSA);
    if (iVar5 == 0) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x80b,"certificate key type mismatch");
      return -0x6d00;
    }
    iVar5 = mbedtls_pk_encrypt(&ssl->session_negotiate->peer_cert->pk,ver,ssl->handshake->pmslen,
                               ssl->out_msg + uVar7 + offset,olen,0x4000 - uVar1,
                               (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,
                               ssl->conf->p_rng);
    if (iVar5 == 0) {
      if (iVar6 == 0) {
        return 0;
      }
      ssl->out_msg[offset] = *(uchar *)((long)olen + 1);
      ssl->out_msg[offset + 1] = (uchar)*olen;
      *olen = *olen + 2;
      return 0;
    }
    text = "mbedtls_rsa_pkcs1_encrypt";
    iVar6 = 0x815;
  }
  else {
    text = "f_rng";
    iVar6 = 0x7f9;
  }
  mbedtls_debug_print_ret
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
             ,iVar6,text,iVar5);
  return iVar5;
}

Assistant:

static int ssl_write_encrypted_pms( mbedtls_ssl_context *ssl,
                                    size_t offset, size_t *olen,
                                    size_t pms_offset )
{
    int ret;
    size_t len_bytes = ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 ? 0 : 2;
    unsigned char *p = ssl->handshake->premaster + pms_offset;

    if( offset + len_bytes > MBEDTLS_SSL_MAX_CONTENT_LEN )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "buffer too small for encrypted pms" ) );
        return( MBEDTLS_ERR_SSL_BUFFER_TOO_SMALL );
    }

    /*
     * Generate (part of) the pre-master as
     *  struct {
     *      ProtocolVersion client_version;
     *      opaque random[46];
     *  } PreMasterSecret;
     */
    mbedtls_ssl_write_version( ssl->conf->max_major_ver, ssl->conf->max_minor_ver,
                       ssl->conf->transport, p );

    if( ( ret = ssl->conf->f_rng( ssl->conf->p_rng, p + 2, 46 ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "f_rng", ret );
        return( ret );
    }

    ssl->handshake->pmslen = 48;

    if( ssl->session_negotiate->peer_cert == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "certificate required" ) );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

    /*
     * Now write it out, encrypted
     */
    if( ! mbedtls_pk_can_do( &ssl->session_negotiate->peer_cert->pk,
                MBEDTLS_PK_RSA ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "certificate key type mismatch" ) );
        return( MBEDTLS_ERR_SSL_PK_TYPE_MISMATCH );
    }

    if( ( ret = mbedtls_pk_encrypt( &ssl->session_negotiate->peer_cert->pk,
                            p, ssl->handshake->pmslen,
                            ssl->out_msg + offset + len_bytes, olen,
                            MBEDTLS_SSL_MAX_CONTENT_LEN - offset - len_bytes,
                            ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_rsa_pkcs1_encrypt", ret );
        return( ret );
    }

#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if( len_bytes == 2 )
    {
        ssl->out_msg[offset+0] = (unsigned char)( *olen >> 8 );
        ssl->out_msg[offset+1] = (unsigned char)( *olen      );
        *olen += 2;
    }
#endif

    return( 0 );
}